

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroller.cpp
# Opt level: O2

void __thiscall
QtMWidgets::ScrollerPrivate::ScrollerPrivate(ScrollerPrivate *this,Scroller *parent,QObject *t)

{
  this->q = parent;
  this->target = t;
  this->minVelocity = 0;
  this->maxVelocity = 0;
  this->startDragDistance = 0;
  QEasingCurve::QEasingCurve(&this->scrollingCurve,OutCirc);
  (this->elapsed).t1 = -0x8000000000000000;
  (this->elapsed).t2 = -0x8000000000000000;
  (this->pos).xp = 0;
  (this->pos).yp = 0;
  this->scrollTime = 3000;
  this->xVelocity = 0.0;
  this->yVelocity = 0.0;
  this->mousePressed = false;
  this->maxPause = 300;
  this->scrollAnimation = (QVariantAnimation *)0x0;
  this->distance = 0;
  return;
}

Assistant:

ScrollerPrivate( Scroller * parent, QObject * t )
		:	q( parent )
		,	target( t )
		,	minVelocity( 0 )
		,	maxVelocity( 0 )
		,	startDragDistance( 0 )
		,	scrollingCurve( QEasingCurve::OutCirc )
		,	scrollTime( 3000 )
		,	xVelocity( 0.0 )
		,	yVelocity( 0.0 )
		,	mousePressed( false )
		,	maxPause( 300 )
		,	scrollAnimation( 0 )
		,	distance( 0 )
	{
	}